

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_Snapshot::_Run(_Test_Snapshot *this)

{
  DB *pDVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  allocator local_14a1;
  Snapshot local_14a0 [4];
  undefined1 local_1480 [455];
  allocator local_12b9;
  Snapshot local_12b8 [4];
  undefined1 local_1298 [455];
  allocator local_10d1;
  Snapshot local_10d0 [4];
  undefined1 local_10b0 [455];
  allocator local_ee9;
  Snapshot local_ee8 [4];
  undefined1 local_ec8 [455];
  allocator local_d01;
  Snapshot local_d00 [4];
  undefined1 local_ce0 [455];
  allocator local_b19;
  Snapshot local_b18 [4];
  undefined1 local_af8 [455];
  allocator local_931;
  Snapshot local_930 [4];
  undefined1 local_910 [455];
  allocator local_749;
  Snapshot local_748 [4];
  undefined1 local_728 [455];
  allocator local_561;
  Snapshot local_560 [4];
  undefined1 local_540 [455];
  allocator local_379;
  Snapshot local_378 [4];
  undefined1 local_358 [455];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  undefined1 local_148 [16];
  Snapshot *s3;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  undefined1 local_e8 [16];
  Snapshot *s2;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [16];
  Snapshot *s1;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  undefined1 local_18 [16];
  _Test_Snapshot *this_local;
  
  local_18._8_8_ = this;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"foo",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"v1",(allocator *)((long)&s1 + 7));
    DBTest::Put((DBTest *)local_18,(string *)this,(string *)local_38);
    Status::~Status((Status *)local_18);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)((long)&s1 + 7));
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    iVar3 = (*((this->super_DBTest).db_)->_vptr_DB[7])();
    local_88._8_8_ = CONCAT44(extraout_var,iVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"foo",&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"v2",(allocator *)((long)&s2 + 7));
    DBTest::Put((DBTest *)local_88,(string *)this,(string *)local_a8);
    Status::~Status((Status *)local_88);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&s2 + 7));
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    iVar3 = (*((this->super_DBTest).db_)->_vptr_DB[7])();
    local_e8._8_8_ = CONCAT44(extraout_var_00,iVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"foo",&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"v3",(allocator *)((long)&s3 + 7));
    DBTest::Put((DBTest *)local_e8,(string *)this,(string *)local_108);
    Status::~Status((Status *)local_e8);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)((long)&s3 + 7));
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    local_148._8_4_ = (*((this->super_DBTest).db_)->_vptr_DB[7])();
    local_148._12_4_ = extraout_var_01;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"foo",&local_169);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,"v4",&local_191);
    DBTest::Put((DBTest *)local_148,(string *)this,(string *)local_168);
    Status::~Status((Status *)local_148);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    test::Tester::Tester
              ((Tester *)(local_358 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x519);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_378,"foo",&local_379);
    DBTest::Get((DBTest *)local_358,(string *)this,local_378);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_358 + 0x20),(char (*) [3])"v1",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
    std::__cxx11::string::~string((string *)local_358);
    std::__cxx11::string::~string((string *)local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
    test::Tester::~Tester((Tester *)(local_358 + 0x20));
    test::Tester::Tester
              ((Tester *)(local_540 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x51a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_560,"foo",&local_561);
    DBTest::Get((DBTest *)local_540,(string *)this,local_560);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_540 + 0x20),(char (*) [3])"v2",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540);
    std::__cxx11::string::~string((string *)local_540);
    std::__cxx11::string::~string((string *)local_560);
    std::allocator<char>::~allocator((allocator<char> *)&local_561);
    test::Tester::~Tester((Tester *)(local_540 + 0x20));
    test::Tester::Tester
              ((Tester *)(local_728 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x51b);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_748,"foo",&local_749);
    DBTest::Get((DBTest *)local_728,(string *)this,local_748);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_728 + 0x20),(char (*) [3])"v3",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_728);
    std::__cxx11::string::~string((string *)local_728);
    std::__cxx11::string::~string((string *)local_748);
    std::allocator<char>::~allocator((allocator<char> *)&local_749);
    test::Tester::~Tester((Tester *)(local_728 + 0x20));
    test::Tester::Tester
              ((Tester *)(local_910 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x51c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_930,"foo",&local_931);
    DBTest::Get((DBTest *)local_910,(string *)this,local_930);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_910 + 0x20),(char (*) [3])"v4",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_910);
    std::__cxx11::string::~string((string *)local_910);
    std::__cxx11::string::~string((string *)local_930);
    std::allocator<char>::~allocator((allocator<char> *)&local_931);
    test::Tester::~Tester((Tester *)(local_910 + 0x20));
    pDVar1 = (this->super_DBTest).db_;
    (*pDVar1->_vptr_DB[8])(pDVar1,local_148._8_8_);
    test::Tester::Tester
              ((Tester *)(local_af8 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x51f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_b18,"foo",&local_b19);
    DBTest::Get((DBTest *)local_af8,(string *)this,local_b18);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_af8 + 0x20),(char (*) [3])"v1",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_af8);
    std::__cxx11::string::~string((string *)local_af8);
    std::__cxx11::string::~string((string *)local_b18);
    std::allocator<char>::~allocator((allocator<char> *)&local_b19);
    test::Tester::~Tester((Tester *)(local_af8 + 0x20));
    test::Tester::Tester
              ((Tester *)(local_ce0 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x520);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_d00,"foo",&local_d01);
    DBTest::Get((DBTest *)local_ce0,(string *)this,local_d00);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_ce0 + 0x20),(char (*) [3])"v2",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ce0);
    std::__cxx11::string::~string((string *)local_ce0);
    std::__cxx11::string::~string((string *)local_d00);
    std::allocator<char>::~allocator((allocator<char> *)&local_d01);
    test::Tester::~Tester((Tester *)(local_ce0 + 0x20));
    test::Tester::Tester
              ((Tester *)(local_ec8 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x521);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_ee8,"foo",&local_ee9);
    DBTest::Get((DBTest *)local_ec8,(string *)this,local_ee8);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_ec8 + 0x20),(char (*) [3])"v4",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ec8);
    std::__cxx11::string::~string((string *)local_ec8);
    std::__cxx11::string::~string((string *)local_ee8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ee9);
    test::Tester::~Tester((Tester *)(local_ec8 + 0x20));
    pDVar1 = (this->super_DBTest).db_;
    (*pDVar1->_vptr_DB[8])(pDVar1,local_88._8_8_);
    test::Tester::Tester
              ((Tester *)(local_10b0 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x524);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_10d0,"foo",&local_10d1);
    DBTest::Get((DBTest *)local_10b0,(string *)this,local_10d0);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_10b0 + 0x20),(char (*) [3])"v2",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10b0);
    std::__cxx11::string::~string((string *)local_10b0);
    std::__cxx11::string::~string((string *)local_10d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_10d1);
    test::Tester::~Tester((Tester *)(local_10b0 + 0x20));
    test::Tester::Tester
              ((Tester *)(local_1298 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x525);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_12b8,"foo",&local_12b9);
    DBTest::Get((DBTest *)local_1298,(string *)this,local_12b8);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_1298 + 0x20),(char (*) [3])"v4",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1298);
    std::__cxx11::string::~string((string *)local_1298);
    std::__cxx11::string::~string((string *)local_12b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_12b9);
    test::Tester::~Tester((Tester *)(local_1298 + 0x20));
    pDVar1 = (this->super_DBTest).db_;
    (*pDVar1->_vptr_DB[8])(pDVar1,local_e8._8_8_);
    test::Tester::Tester
              ((Tester *)(local_1480 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x528);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_14a0,"foo",&local_14a1);
    DBTest::Get((DBTest *)local_1480,(string *)this,local_14a0);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_1480 + 0x20),(char (*) [3])"v4",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1480);
    std::__cxx11::string::~string((string *)local_1480);
    std::__cxx11::string::~string((string *)local_14a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_14a1);
    test::Tester::~Tester((Tester *)(local_1480 + 0x20));
    bVar2 = DBTest::ChangeOptions(&this->super_DBTest);
  } while (bVar2);
  return;
}

Assistant:

TEST(DBTest, Snapshot) {
  do {
    Put("foo", "v1");
    const Snapshot* s1 = db_->GetSnapshot();
    Put("foo", "v2");
    const Snapshot* s2 = db_->GetSnapshot();
    Put("foo", "v3");
    const Snapshot* s3 = db_->GetSnapshot();

    Put("foo", "v4");
    ASSERT_EQ("v1", Get("foo", s1));
    ASSERT_EQ("v2", Get("foo", s2));
    ASSERT_EQ("v3", Get("foo", s3));
    ASSERT_EQ("v4", Get("foo"));

    db_->ReleaseSnapshot(s3);
    ASSERT_EQ("v1", Get("foo", s1));
    ASSERT_EQ("v2", Get("foo", s2));
    ASSERT_EQ("v4", Get("foo"));

    db_->ReleaseSnapshot(s1);
    ASSERT_EQ("v2", Get("foo", s2));
    ASSERT_EQ("v4", Get("foo"));

    db_->ReleaseSnapshot(s2);
    ASSERT_EQ("v4", Get("foo"));
  } while (ChangeOptions());
}